

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

V0LayerParameter * __thiscall caffe::V0LayerParameter::New(V0LayerParameter *this,Arena *arena)

{
  V0LayerParameter *this_00;
  
  this_00 = (V0LayerParameter *)operator_new(0x100);
  V0LayerParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::V0LayerParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

V0LayerParameter* V0LayerParameter::New(::google::protobuf::Arena* arena) const {
  V0LayerParameter* n = new V0LayerParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}